

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkobj.c
# Opt level: O0

int rndmonnum(level *lev)

{
  boolean bVar1;
  permonst *ptr_00;
  bool bVar2;
  int i;
  permonst *ptr;
  level *lev_local;
  
  ptr_00 = rndmonst(lev);
  if (ptr_00 == (permonst *)0x0) {
    do {
      lev_local._4_4_ = rn2(0x158);
      bVar2 = true;
      if ((mons[lev_local._4_4_].geno & 0x200) == 0) {
        bVar1 = In_hell(&lev->z);
        bVar2 = false;
        if (bVar1 == '\0') {
          bVar2 = (mons[lev_local._4_4_].geno & 0x400) != 0;
        }
      }
    } while (bVar2);
  }
  else {
    lev_local._4_4_ = monsndx(ptr_00);
  }
  return lev_local._4_4_;
}

Assistant:

int rndmonnum(struct level *lev)
{
	const struct permonst *ptr;
	int i;

	/* Plan A: get a level-appropriate common monster */
	ptr = rndmonst(lev);
	if (ptr) return monsndx(ptr);

	/* Plan B: get any common monster */
	do {
	    i = rn1(SPECIAL_PM - LOW_PM, LOW_PM);
	    ptr = &mons[i];
	} while ((ptr->geno & G_NOGEN) || (!In_hell(&lev->z) && (ptr->geno & G_HELL)));

	return i;
}